

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int main(void)

{
  string local_148;
  undefined1 local_128 [8];
  YAJLImage image;
  undefined1 local_a8 [8];
  bitio_stream bstream;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string filename;
  
  filename.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"/home/supercmmetry/Pictures/supercmmetry.jpg",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string
            ((string *)&image.use_minimal_scan,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  bitio::bitio_stream::bitio_stream
            ((bitio_stream *)local_a8,(string *)&image.use_minimal_scan,READ,0x400);
  std::__cxx11::string::~string((string *)&image.use_minimal_scan);
  YAJLImage::YAJLImage((YAJLImage *)local_128,false);
  std::__cxx11::string::string
            ((string *)&local_148,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  YAJLImage::set_src((YAJLImage *)local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  YAJLImage::scan_markers((YAJLImage *)local_128);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  filename.field_2._12_4_ = 0;
  YAJLImage::~YAJLImage((YAJLImage *)local_128);
  bitio::bitio_stream::~bitio_stream((bitio_stream *)local_a8);
  std::__cxx11::string::~string((string *)local_30);
  return filename.field_2._12_4_;
}

Assistant:

int main() {
    std::string filename = "/home/supercmmetry/Pictures/supercmmetry.jpg";
    bitio::bitio_stream bstream(filename, bitio::READ);

    YAJLImage image(false);
    image.set_src(filename);
    image.scan_markers();
    std::cout << std::endl;
    return 0;
}